

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong *puVar12;
  U32 UVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong *puVar18;
  BYTE *pBVar19;
  int iVar20;
  BYTE *pBVar21;
  ulong *puVar22;
  ulong uVar23;
  long lVar24;
  seqDef *psVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  BYTE *pInLoopLimit;
  BYTE *ip;
  uint uVar31;
  uint uVar32;
  ulong local_b0;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar26 = (ulong *)((long)src + (srcSize - 8));
  pBVar21 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar18 = (ulong *)((ulong)((int)src == (int)pBVar21) + (long)src);
  uVar27 = (int)puVar18 - (int)pBVar21;
  uVar11 = (ulong)uVar5;
  if (uVar27 < uVar5) {
    uVar11 = 0;
  }
  uVar10 = (uint)uVar11;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar30 = (ulong)uVar6;
  if (uVar27 < uVar6) {
    uVar30 = 0;
  }
  uVar31 = (uint)uVar30;
  if (puVar26 <= puVar18) {
LAB_00142d89:
    uVar14 = 0;
    if (uVar27 < uVar5) {
      uVar14 = uVar5;
    }
    if (uVar27 < uVar6) {
      uVar14 = uVar6;
    }
    if (uVar31 == 0) {
      uVar31 = uVar14;
    }
    if (uVar10 != 0) {
      uVar14 = uVar10;
    }
    *rep = uVar31;
    rep[1] = uVar14;
    return (long)puVar4 - (long)src;
  }
  puVar1 = (ulong *)((long)puVar4 - 7);
  puVar2 = (ulong *)((long)puVar4 - 3);
  puVar3 = (ulong *)((long)puVar4 - 1);
LAB_001423fa:
  if (((int)uVar30 == 0) ||
     (*(int *)((long)((long)puVar18 + 1U) - uVar30) != *(int *)((long)puVar18 + 1))) {
    uVar10 = (ms->cParams).minMatch;
    UVar13 = (U32)puVar18;
    if (uVar10 - 6 < 2) {
      uVar10 = (ms->cParams).chainLog;
      uVar17 = 1 << ((byte)uVar10 & 0x1f);
      pUVar8 = ms->chainTable;
      pBVar19 = (ms->window).base;
      uVar31 = (ms->window).lowLimit;
      uVar32 = UVar13 - (int)pBVar19;
      uVar14 = uVar32 - uVar17;
      if (uVar32 < uVar17) {
        uVar14 = 0;
      }
      uVar7 = (ms->cParams).searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar10,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar13);
      if (uVar31 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        local_b0 = 999999999;
        uVar23 = 3;
        do {
          puVar29 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar23 + (long)puVar29) == *(char *)((long)puVar18 + uVar23)) {
            puVar12 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar29 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar24 = 0;
                do {
                  puVar12 = (ulong *)((long)puVar18 + lVar24 + 8);
                  if (puVar1 <= puVar12) {
                    puVar29 = (ulong *)(pBVar19 + lVar24 + lVar15);
                    goto LAB_001425cb;
                  }
                  lVar9 = lVar24 + lVar15;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar12);
                uVar16 = *puVar12 ^ *(ulong *)(pBVar19 + lVar9);
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar16 = *puVar18 ^ *puVar29;
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = uVar28 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001425cb:
              if ((puVar12 < puVar2) && ((int)*puVar29 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar12 < puVar3) && ((short)*puVar29 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar12 < puVar4) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar29 == (char)*puVar12));
              }
              uVar28 = (long)puVar12 - (long)puVar18;
            }
            if ((uVar23 < uVar28) &&
               (local_b0 = (ulong)((uVar32 + 2) - uVar10), uVar23 = uVar28,
               (ulong *)(uVar28 + (long)puVar18) == puVar4)) goto LAB_00142a36;
          }
          uVar28 = uVar23;
          if ((uVar10 <= uVar14) ||
             ((uVar10 = pUVar8[uVar10 & uVar17 - 1], uVar10 <= uVar31 ||
              (iVar20 = iVar20 + -1, uVar23 = uVar28, iVar20 == 0)))) goto LAB_00142a36;
        } while( true );
      }
    }
    else if (uVar10 == 5) {
      uVar10 = (ms->cParams).chainLog;
      uVar17 = 1 << ((byte)uVar10 & 0x1f);
      pUVar8 = ms->chainTable;
      pBVar19 = (ms->window).base;
      uVar31 = (ms->window).lowLimit;
      uVar32 = UVar13 - (int)pBVar19;
      uVar14 = uVar32 - uVar17;
      if (uVar32 < uVar17) {
        uVar14 = 0;
      }
      uVar7 = (ms->cParams).searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar10,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar13);
      if (uVar31 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        local_b0 = 999999999;
        uVar23 = 3;
        do {
          puVar29 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar23 + (long)puVar29) == *(char *)((long)puVar18 + uVar23)) {
            puVar12 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar29 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar24 = 0;
                do {
                  puVar12 = (ulong *)((long)puVar18 + lVar24 + 8);
                  if (puVar1 <= puVar12) {
                    puVar29 = (ulong *)(pBVar19 + lVar24 + lVar15);
                    goto LAB_001427b4;
                  }
                  lVar9 = lVar24 + lVar15;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar12);
                uVar16 = *puVar12 ^ *(ulong *)(pBVar19 + lVar9);
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar16 = *puVar18 ^ *puVar29;
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = uVar28 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001427b4:
              if ((puVar12 < puVar2) && ((int)*puVar29 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar12 < puVar3) && ((short)*puVar29 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar12 < puVar4) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar29 == (char)*puVar12));
              }
              uVar28 = (long)puVar12 - (long)puVar18;
            }
            if ((uVar23 < uVar28) &&
               (local_b0 = (ulong)((uVar32 + 2) - uVar10), uVar23 = uVar28,
               (ulong *)(uVar28 + (long)puVar18) == puVar4)) goto LAB_00142a36;
          }
          uVar28 = uVar23;
          if ((uVar10 <= uVar14) ||
             ((uVar10 = pUVar8[uVar10 & uVar17 - 1], uVar10 <= uVar31 ||
              (iVar20 = iVar20 + -1, uVar23 = uVar28, iVar20 == 0)))) goto LAB_00142a36;
        } while( true );
      }
    }
    else {
      uVar10 = (ms->cParams).chainLog;
      uVar17 = 1 << ((byte)uVar10 & 0x1f);
      pUVar8 = ms->chainTable;
      pBVar19 = (ms->window).base;
      uVar31 = (ms->window).lowLimit;
      uVar32 = UVar13 - (int)pBVar19;
      uVar14 = uVar32 - uVar17;
      if (uVar32 < uVar17) {
        uVar14 = 0;
      }
      uVar7 = (ms->cParams).searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar10,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar13);
      if (uVar31 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        local_b0 = 999999999;
        uVar23 = 3;
        do {
          puVar29 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar23 + (long)puVar29) == *(char *)((long)puVar18 + uVar23)) {
            puVar12 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar29 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar24 = 0;
                do {
                  puVar12 = (ulong *)((long)puVar18 + lVar24 + 8);
                  if (puVar1 <= puVar12) {
                    puVar29 = (ulong *)(pBVar19 + lVar24 + lVar15);
                    goto LAB_0014299d;
                  }
                  lVar9 = lVar24 + lVar15;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar12);
                uVar16 = *puVar12 ^ *(ulong *)(pBVar19 + lVar9);
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar16 = *puVar18 ^ *puVar29;
                uVar28 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = uVar28 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0014299d:
              if ((puVar12 < puVar2) && ((int)*puVar29 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar12 < puVar3) && ((short)*puVar29 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar12 < puVar4) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar29 == (char)*puVar12));
              }
              uVar28 = (long)puVar12 - (long)puVar18;
            }
            if ((uVar23 < uVar28) &&
               (local_b0 = (ulong)((uVar32 + 2) - uVar10), uVar23 = uVar28,
               (ulong *)(uVar28 + (long)puVar18) == puVar4)) goto LAB_00142a36;
          }
          uVar28 = uVar23;
          if ((uVar10 <= uVar14) ||
             ((uVar10 = pUVar8[uVar10 & uVar17 - 1], uVar10 <= uVar31 ||
              (iVar20 = iVar20 + -1, uVar23 = uVar28, iVar20 == 0)))) goto LAB_00142a36;
        } while( true );
      }
    }
    goto LAB_00142a3c;
  }
  lVar15 = -uVar30;
  puVar29 = (ulong *)((long)puVar18 + 5);
  puVar22 = (ulong *)((long)puVar18 + lVar15 + 5);
  puVar12 = puVar29;
  if (puVar29 < puVar1) {
    if (*puVar22 == *puVar29) {
      lVar24 = 0;
      do {
        puVar12 = (ulong *)((long)puVar18 + lVar24 + 0xd);
        if (puVar1 <= puVar12) {
          puVar22 = (ulong *)((long)puVar18 + lVar15 + lVar24 + 0xd);
          puVar12 = (ulong *)((long)puVar18 + lVar24 + 0xd);
          goto LAB_00142aef;
        }
        uVar23 = *(ulong *)((long)puVar18 + lVar24 + lVar15 + 0xd);
        uVar28 = *puVar12;
        lVar24 = lVar24 + 8;
      } while (uVar23 == uVar28);
      uVar28 = uVar28 ^ uVar23;
      uVar23 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      uVar28 = (uVar23 >> 3 & 0x1fffffff) + lVar24;
    }
    else {
      uVar28 = *puVar29 ^ *puVar22;
      uVar23 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      uVar28 = uVar23 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_00142aef:
    if ((puVar12 < puVar2) && ((int)*puVar22 == (int)*puVar12)) {
      puVar12 = (ulong *)((long)puVar12 + 4);
      puVar22 = (ulong *)((long)puVar22 + 4);
    }
    if ((puVar12 < puVar3) && ((short)*puVar22 == (short)*puVar12)) {
      puVar12 = (ulong *)((long)puVar12 + 2);
      puVar22 = (ulong *)((long)puVar22 + 2);
    }
    if (puVar12 < puVar4) {
      puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar22 == (char)*puVar12));
    }
    uVar28 = (long)puVar12 - (long)puVar29;
  }
  uVar28 = uVar28 + 4;
  UVar13 = 1;
  puVar18 = (ulong *)((long)puVar18 + 1U);
  goto LAB_00142b40;
LAB_00142a36:
  if (uVar28 < 4) {
LAB_00142a3c:
    puVar18 = (ulong *)((long)puVar18 + ((long)puVar18 - (long)src >> 8) + 1);
  }
  else {
    if (local_b0 == 0) {
      UVar13 = 1;
    }
    else {
      if ((src < puVar18) && (pBVar21 < (BYTE *)((long)puVar18 + (2 - local_b0)))) {
        puVar29 = puVar18;
        while (puVar18 = puVar29,
              *(char *)((long)puVar29 - 1) == *(char *)((long)puVar29 + (1 - local_b0))) {
          puVar18 = (ulong *)((long)puVar29 - 1);
          uVar28 = uVar28 + 1;
          if ((puVar18 <= src) ||
             (pBVar19 = (BYTE *)((long)puVar29 + (1 - local_b0)), puVar29 = puVar18,
             pBVar19 <= pBVar21)) break;
        }
      }
      UVar13 = (int)local_b0 + 1;
      uVar11 = uVar30;
      uVar30 = (ulong)((int)local_b0 - 2);
    }
LAB_00142b40:
    uVar23 = (long)puVar18 - (long)src;
    puVar12 = (ulong *)seqStore->lit;
    puVar29 = (ulong *)((long)puVar12 + uVar23);
    do {
      *puVar12 = *src;
      puVar12 = puVar12 + 1;
      src = (void *)((long)src + 8);
    } while (puVar12 < puVar29);
    seqStore->lit = seqStore->lit + uVar23;
    if (uVar23 < 0x10000) {
      psVar25 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar25 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->litLength = (U16)uVar23;
    psVar25->offset = UVar13;
    if (0xffff < uVar28 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->matchLength = (U16)(uVar28 - 3);
    seqStore->sequences = psVar25 + 1;
    puVar18 = (ulong *)((long)puVar18 + uVar28);
    src = puVar18;
    if (((int)uVar11 != 0) && (puVar18 <= puVar26)) {
      while (uVar28 = uVar30, uVar23 = uVar11, uVar11 = uVar23, src = puVar18, uVar30 = uVar28,
            (int)*puVar18 == *(int *)((long)puVar18 - uVar23)) {
        lVar15 = -uVar23;
        puVar29 = (ulong *)((long)puVar18 + 4);
        puVar22 = (ulong *)((long)puVar18 + lVar15 + 4);
        puVar12 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar22 == *puVar29) {
            lVar24 = 0;
            do {
              puVar12 = (ulong *)((long)puVar18 + lVar24 + 0xc);
              if (puVar1 <= puVar12) {
                puVar22 = (ulong *)((long)puVar18 + lVar15 + lVar24 + 0xc);
                puVar12 = (ulong *)((long)puVar18 + lVar24 + 0xc);
                goto LAB_00142c74;
              }
              uVar11 = *(ulong *)((long)puVar18 + lVar24 + lVar15 + 0xc);
              uVar30 = *puVar12;
              lVar24 = lVar24 + 8;
            } while (uVar11 == uVar30);
            uVar30 = uVar30 ^ uVar11;
            uVar11 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = (uVar11 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar30 = *puVar29 ^ *puVar22;
            uVar11 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = uVar11 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00142c74:
          if ((puVar12 < puVar2) && ((int)*puVar22 == (int)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar12 < puVar3) && ((short)*puVar22 == (short)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar12 < puVar4) {
            puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar22 == (char)*puVar12));
          }
          uVar11 = (long)puVar12 - (long)puVar29;
        }
        *(ulong *)seqStore->lit = *puVar18;
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offset = 1;
        if (0xffff < uVar11 + 1) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->matchLength = (U16)(uVar11 + 1);
        seqStore->sequences = psVar25 + 1;
        puVar18 = (ulong *)((long)puVar18 + uVar11 + 4);
        uVar11 = uVar28;
        src = puVar18;
        uVar30 = uVar23;
        if (((int)uVar28 == 0) || (puVar26 < puVar18)) break;
      }
    }
  }
  uVar10 = (uint)uVar11;
  uVar31 = (uint)uVar30;
  if (puVar26 <= puVar18) goto LAB_00142d89;
  goto LAB_001423fa;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_noDict);
}